

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O0

string * __thiscall
cmQtAutoGen::FileNameWithoutLastExtension_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGen *this,string_view filename)

{
  allocator<char> local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  size_type local_30;
  size_type dotPos;
  size_type slashPos;
  string_view filename_local;
  
  filename_local._M_len = filename._M_len;
  slashPos = (size_type)this;
  filename_local._M_str = (char *)__return_storage_ptr__;
  dotPos = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                     ((basic_string_view<char,_std::char_traits<char>_> *)&slashPos,'/',
                      0xffffffffffffffff);
  if (dotPos != 0xffffffffffffffff) {
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)&slashPos,dotPos + 1);
  }
  local_30 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                       ((basic_string_view<char,_std::char_traits<char>_> *)&slashPos,'.',
                        0xffffffffffffffff);
  local_40 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       ((basic_string_view<char,_std::char_traits<char>_> *)&slashPos,0,local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,&local_40,&local_41);
  std::allocator<char>::~allocator(&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::FileNameWithoutLastExtension(cm::string_view filename)
{
  auto slashPos = filename.rfind('/');
  if (slashPos != cm::string_view::npos) {
    filename.remove_prefix(slashPos + 1);
  }
  auto dotPos = filename.rfind('.');
  return std::string(filename.substr(0, dotPos));
}